

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_optimize.cc
# Opt level: O0

void __thiscall pass_dead_code_elimination_3_Test::TestBody(pass_dead_code_elimination_3_Test *this)

{
  bool bVar1;
  Generator *pGVar2;
  Generator *pGVar3;
  Port *pPVar4;
  Var *pVVar5;
  Expr *right;
  char *pcVar6;
  char *in_R9;
  AssertHelper local_348;
  Message local_340;
  int local_334;
  uint64_t local_330;
  undefined1 local_328 [8];
  AssertionResult gtest_ar;
  AssertHelper local_2f8;
  Message local_2f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2e8;
  bool local_2c9;
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar_;
  string local_2b0;
  Var *local_290;
  Var *v2;
  string local_280;
  Var *local_260;
  Var *v1;
  string local_250;
  Var *local_230;
  Var *v;
  string local_220;
  Port *local_200;
  Port *in2;
  string local_1f0;
  Port *local_1d0;
  Port *in1;
  string local_1c0;
  allocator<char> local_199;
  string local_198;
  Generator *local_178;
  Generator *child;
  allocator<char> local_159;
  string local_158;
  Generator *local_138;
  Generator *mod;
  Context ctx;
  pass_dead_code_elimination_3_Test *this_local;
  
  ctx.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)this;
  kratos::Context::Context((Context *)&mod);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"mod",&local_159);
  pGVar2 = kratos::Context::generator((Context *)&mod,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  local_138 = pGVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"child",&local_199);
  pGVar3 = kratos::Context::generator((Context *)&mod,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  pGVar2 = local_138;
  local_178 = pGVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"inst",(allocator<char> *)((long)&in1 + 7));
  kratos::Generator::add_child_generator(pGVar2,&local_1c0,local_178);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&in1 + 7));
  pGVar2 = local_178;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"in1",(allocator<char> *)((long)&in2 + 7));
  pPVar4 = kratos::Generator::port(pGVar2,In,&local_1f0,1);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&in2 + 7));
  pGVar2 = local_178;
  local_1d0 = pPVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"in2",(allocator<char> *)((long)&v + 7));
  pPVar4 = kratos::Generator::port(pGVar2,In,&local_220,1);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator((allocator<char> *)((long)&v + 7));
  pGVar2 = local_178;
  local_200 = pPVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,"v",(allocator<char> *)((long)&v1 + 7));
  pVVar5 = kratos::Generator::var(pGVar2,&local_250,1);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator((allocator<char> *)((long)&v1 + 7));
  pGVar2 = local_178;
  local_230 = pVVar5;
  right = kratos::Var::operator&(&local_1d0->super_Var,&local_200->super_Var);
  kratos::Generator::wire(pGVar2,pVVar5,&right->super_Var);
  pGVar2 = local_138;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_280,"v1",(allocator<char> *)((long)&v2 + 7));
  pVVar5 = kratos::Generator::var(pGVar2,&local_280,1);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator((allocator<char> *)((long)&v2 + 7));
  pGVar2 = local_138;
  local_260 = pVVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b0,"v2",
             (allocator<char> *)
             ((long)&gtest_ar_.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  pVVar5 = kratos::Generator::var(pGVar2,&local_2b0,1);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar_.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_290 = pVVar5;
  kratos::Generator::wire(local_138,&local_1d0->super_Var,local_260);
  kratos::Generator::wire(local_138,&local_200->super_Var,local_290);
  kratos::fix_assignment_type(local_138);
  kratos::verify_generator_connectivity(local_138);
  kratos::verify_assignments(local_138);
  kratos::dead_code_elimination(local_138);
  kratos::Generator::get_vars_abi_cxx11_(&local_2e8,local_138);
  local_2c9 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&local_2e8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2c8,&local_2c9,(type *)0x0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c8);
  if (!bVar1) {
    testing::Message::Message(&local_2f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_2c8,
               (AssertionResult *)"mod.get_vars().empty()","false","true",in_R9);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0x1c7,pcVar6);
    testing::internal::AssertHelper::operator=(&local_2f8,&local_2f0);
    testing::internal::AssertHelper::~AssertHelper(&local_2f8);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_2f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
  local_330 = kratos::Generator::get_child_generator_size(local_138);
  local_334 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_328,"mod.get_child_generator_size()","0",&local_330,&local_334);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_328);
  if (!bVar1) {
    testing::Message::Message(&local_340);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_328);
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0x1c8,pcVar6);
    testing::internal::AssertHelper::operator=(&local_348,&local_340);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    testing::Message::~Message(&local_340);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_328);
  kratos::Context::~Context((Context *)&mod);
  return;
}

Assistant:

TEST(pass, dead_code_elimination_3) {
    // cross boundary of modules
    Context ctx;
    auto &mod = ctx.generator("mod");
    auto &child = ctx.generator("child");
    mod.add_child_generator("inst", child);
    auto &in1 = child.port(PortDirection::In, "in1", 1);
    auto &in2 = child.port(PortDirection::In, "in2", 1);
    auto &v = child.var("v", 1);
    child.wire(v, in1 & in2);
    auto &v1 = mod.var("v1", 1);
    auto &v2 = mod.var("v2", 1);
    mod.wire(in1, v1);
    mod.wire(in2, v2);

    fix_assignment_type(&mod);
    verify_generator_connectivity(&mod);
    verify_assignments(&mod);

    dead_code_elimination(&mod);
    EXPECT_TRUE(mod.get_vars().empty());
    EXPECT_EQ(mod.get_child_generator_size(), 0);
}